

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_on_walk_effects.hpp
# Opt level: O0

uint32_t __thiscall
PatchOnWalkEffects::inject_func_handle_item_abilities_on_walk(PatchOnWalkEffects *this,ROM *rom)

{
  uint32_t uVar1;
  allocator<char> local_1b9;
  string local_1b8;
  allocator<char> local_191;
  string local_190;
  AddressRegister local_170;
  DataRegister local_160;
  allocator<char> local_149;
  string local_148;
  Param local_128 [2];
  allocator<char> local_111;
  string local_110;
  DataRegister local_f0;
  allocator<char> local_d9;
  string local_d8;
  Param local_a8 [2];
  undefined1 local_98 [8];
  Code func_handle_walk_abilities;
  uint16_t GOLDS_PER_CYCLE;
  ROM *rom_local;
  PatchOnWalkEffects *this_local;
  
  func_handle_walk_abilities._labels._M_t._M_impl.super__Rb_tree_header._M_node_count._6_2_ = 1;
  md::Code::Code((Code *)local_98);
  addr_<void>((uint32_t)local_a8,0xff104e);
  md::Code::btst((Code *)local_98,'\x05',local_a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"healing_boots",&local_d9);
  md::Code::beq((Code *)local_98,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  md::DataRegister::DataRegister(&local_f0,'\0');
  md::Code::movew((Code *)local_98,1,(Param *)&local_f0);
  md::Code::jsr((Code *)local_98,0x177dc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"healing_boots",&local_111);
  md::Code::label((Code *)local_98,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  addr_<void>((uint32_t)local_128,0xff1150);
  md::Code::cmpib((Code *)local_98,'\a',local_128);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"return",&local_149);
  md::Code::bne((Code *)local_98,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  md::DataRegister::DataRegister(&local_160,'\0');
  md::Code::movew((Code *)local_98,0x100,(Param *)&local_160);
  md::AddressRegister::AddressRegister(&local_170,'\x05');
  md::Code::lea((Code *)local_98,0xff5400,&local_170);
  md::Code::jsr((Code *)local_98,0x1780e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"return",&local_191);
  md::Code::label((Code *)local_98,&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator(&local_191);
  md::Code::rts((Code *)local_98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"",&local_1b9);
  uVar1 = md::ROM::inject_code(rom,(Code *)local_98,&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  md::Code::~Code((Code *)local_98);
  return uVar1;
}

Assistant:

uint32_t inject_func_handle_item_abilities_on_walk(md::ROM& rom)
    {
        constexpr uint16_t GOLDS_PER_CYCLE = 0x0001;

        md::Code func_handle_walk_abilities;
        {
            func_handle_walk_abilities.btst(0x5, addr_(0xFF104E));
            func_handle_walk_abilities.beq("healing_boots");
            {
                // If Statue of Jypta is owned, gain gold over time
                func_handle_walk_abilities.movew(GOLDS_PER_CYCLE, reg_D0);
                func_handle_walk_abilities.jsr(0x177DC);   // rom.stored_address("func_earn_gold");
            }
            func_handle_walk_abilities.label("healing_boots");
            func_handle_walk_abilities.cmpib(0x7, addr_(0xFF1150));
            func_handle_walk_abilities.bne("return");
            {
                // If Healing boots are equipped, gain life over time
                func_handle_walk_abilities.movew(0x100, reg_D0);
                func_handle_walk_abilities.lea(0xFF5400, reg_A5);
                func_handle_walk_abilities.jsr(0x1780E);   // rom.stored_address("func_heal_hp");
            }
            func_handle_walk_abilities.label("return");
            func_handle_walk_abilities.rts();
        }

        return rom.inject_code(func_handle_walk_abilities);
    }